

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

void __thiscall Strings::QuotedEncoding::quoteChar(QuotedEncoding *this,char c)

{
  char c_00;
  
  if (this->lastOne != -1) {
    if (c == '\n' && this->lastOne == 0xd) {
      Bstrlib::String::operator+=(this->out,'\r');
      this->lineLength = 0;
    }
    if ((c == '\r') || (c == '\n')) {
      writeHex(this,(char)this->lastOne);
    }
    else {
      c_00 = (char)this->lastOne;
      if ((c_00 == '\r') || (c_00 == '\n')) {
        Bstrlib::String::operator+=(this->out,c_00);
        this->lineLength = 0;
      }
      else if (this->lineLength < 0x4b) {
        Bstrlib::String::operator+=(this->out,c_00);
        this->lineLength = this->lineLength + 1;
      }
      else {
        Bstrlib::String::operator+=(this->out,"=\r\n");
        Bstrlib::String::operator+=(this->out,c_00);
        this->lineLength = 1;
      }
    }
    this->lastOne = -1;
  }
  if (c < '\r') {
    if (c == '\t') {
LAB_00114176:
      this->lastOne = (uint)(byte)c;
      return;
    }
    if (c == '\n') goto LAB_0011419d;
  }
  else {
    if (c == '\r') goto LAB_0011419d;
    if (c == ' ') goto LAB_00114176;
  }
  if (c == '=' || 0x5d < (byte)(c - 0x21U)) {
    writeHex(this,c);
    return;
  }
  if ((c != '\r') && (c != '\n')) {
    if (this->lineLength < 0x4b) {
      Bstrlib::String::operator+=(this->out,c);
      this->lineLength = this->lineLength + 1;
      return;
    }
    Bstrlib::String::operator+=(this->out,"=\r\n");
    Bstrlib::String::operator+=(this->out,c);
    this->lineLength = 1;
    return;
  }
LAB_0011419d:
  Bstrlib::String::operator+=(this->out,c);
  this->lineLength = 0;
  return;
}

Assistant:

inline void quoteChar(const char c)
        {
            if (lastOne != -1)
            {
                // CRLF is allowed on end of line
                if (lastOne == '\r' && c == '\n')
			        writeASCII((char)lastOne);
	            if (c == '\r' || c == '\n')
		            writeHex((char)lastOne);
	            else writeASCII((char)lastOne);

	            lastOne = -1;
            }
            if (c == '\t' || c == ' ') lastOne = (int)c;
            else if (c == '\r' || c == '\n' || (c > 32 && c < 127 && c != '=')) writeASCII(c);
            else writeHex(c);
        }